

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChUtilsCreators.cpp
# Opt level: O2

bool chrono::utils::AddTriangleMeshConvexDecompositionSplit
               (ChSystem *system,shared_ptr<chrono::ChMaterialSurface> *material,
               string *obj_filename,string *name,ChVector<double> *pos,ChQuaternion<double> *rot,
               double total_mass)

{
  double dVar1;
  pointer pCVar2;
  undefined1 auVar3 [16];
  double dVar4;
  element_type *this;
  element_type *peVar5;
  undefined8 this_00;
  _func_int **pp_Var6;
  int iVar7;
  int iVar8;
  uint uVar9;
  undefined4 extraout_var;
  ostream *poVar10;
  double *pdVar11;
  uint uVar12;
  long lVar13;
  int i;
  ulong uVar14;
  bool bVar15;
  shared_ptr<chrono::ChBody> body;
  double local_468;
  shared_ptr<chrono::geometry::ChTriangleMeshConnected> trimesh_convex_1;
  double mass;
  vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_> convexhull;
  shared_ptr<chrono::ChTriangleMeshShape> trimesh_shape;
  shared_ptr<chrono::geometry::ChTriangleMeshConnected> trimesh;
  undefined1 local_3d8 [16];
  ChVector<double> center;
  __shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2> local_3a8;
  __shared_ptr<chrono::ChVisualShape,(__gnu_cxx::_Lock_policy)2> local_398 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_390;
  __shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2> local_388;
  __shared_ptr<chrono::ChVisualModel,_(__gnu_cxx::_Lock_policy)2> local_378;
  shared_ptr<chrono::ChVisualModel> model;
  __shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2> local_358;
  ChVector<double> local_348;
  ChConvexDecompositionHACDv2 mydecompositionHACDv2;
  ChQuaternion<double> local_2b0;
  ChMatrix33<double> inertia;
  ChTriangleMeshConnected trimesh_convex;
  ChFrame<double> local_b8;
  
  iVar7 = (*((material->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>).
            _M_ptr)->_vptr_ChMaterialSurface[3])();
  iVar8 = (*(system->super_ChIntegrableIIorder).super_ChIntegrable._vptr_ChIntegrable[0x2f])(system)
  ;
  if (iVar7 != iVar8) {
    __assert_fail("material->GetContactMethod() == system->GetContactMethod()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/utils/ChUtilsCreators.cpp"
                  ,399,
                  "bool chrono::utils::AddTriangleMeshConvexDecompositionSplit(ChSystem *, std::shared_ptr<ChMaterialSurface>, const std::string &, const std::string &, const ChVector<> &, const ChQuaternion<> &, double)"
                 );
  }
  bVar15 = false;
  geometry::ChTriangleMeshConnected::CreateFromWavefrontFile
            ((ChTriangleMeshConnected *)&trimesh,obj_filename,true,false);
  if (trimesh.
      super___shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr == (element_type *)0x0) goto LAB_00e34376;
  lVar13 = 0;
  for (uVar14 = 0;
      pCVar2 = ((trimesh.
                 super___shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr)->m_vertices).
               super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
      uVar14 < (ulong)(((long)((trimesh.
                                super___shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr)->m_vertices).
                              super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pCVar2) / 0x18);
      uVar14 = uVar14 + 1) {
    ChQuaternion<double>::Rotate(rot,(ChVector<double> *)((long)pCVar2->m_data + lVar13));
    dVar1 = pos->m_data[2];
    dVar4 = pos->m_data[1];
    pCVar2 = ((trimesh.
               super___shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr)->m_vertices).
             super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pdVar11 = (double *)((long)pCVar2->m_data + lVar13);
    *pdVar11 = pos->m_data[0] +
               (double)trimesh_convex.super_ChTriangleMesh.super_ChGeometry._vptr_ChGeometry;
    pdVar11[1] = dVar4 + (double)trimesh_convex.m_vertices.
                                 super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start;
    *(double *)((long)pCVar2->m_data + lVar13 + 0x10) =
         dVar1 + (double)trimesh_convex.m_vertices.
                         super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
    lVar13 = lVar13 + 0x18;
  }
  collision::ChConvexDecompositionHACDv2::ChConvexDecompositionHACDv2(&mydecompositionHACDv2);
  collision::ChConvexDecompositionHACDv2::Reset(&mydecompositionHACDv2);
  collision::ChConvexDecompositionHACDv2::AddTriangleMesh
            (&mydecompositionHACDv2,
             &(trimesh.
               super___shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr)->super_ChTriangleMesh);
  collision::ChConvexDecompositionHACDv2::SetParameters
            (&mydecompositionHACDv2,0x400,0x100,0x40,0.01,0.1,1e-06);
  collision::ChConvexDecompositionHACDv2::ComputeConvexDecomposition(&mydecompositionHACDv2);
  uVar9 = (*mydecompositionHACDv2.super_ChConvexDecomposition._vptr_ChConvexDecomposition[7])();
  uVar14 = 0;
  center.m_data[2] = 0.0;
  center.m_data[0] = 0.0;
  center.m_data[1] = 0.0;
  body.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  body.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  uVar9 = ~((int)uVar9 >> 0x1f) & uVar9;
  local_468 = 0.0;
  do {
    if (uVar9 == (uint)uVar14) {
      uVar12 = 0;
      local_468 = 1.0 / local_468;
      goto LAB_00e33e82;
    }
    trimesh_convex.m_filename._M_dataplus._M_p = (pointer)&trimesh_convex.m_filename.field_2;
    trimesh_convex.super_ChTriangleMesh.super_ChGeometry._vptr_ChGeometry =
         (ChGeometry)&PTR__ChTriangleMeshConnected_0118aa20;
    trimesh_convex.m_face_mat_indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    trimesh_convex.m_face_mat_indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    trimesh_convex.m_face_mat_indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    trimesh_convex.m_face_n_indices.
    super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    trimesh_convex.m_face_n_indices.
    super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    trimesh_convex.m_face_uv_indices.
    super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    trimesh_convex.m_face_uv_indices.
    super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    trimesh_convex.m_face_uv_indices.
    super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    trimesh_convex.m_face_col_indices.
    super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    trimesh_convex.m_face_col_indices.
    super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    trimesh_convex.m_face_col_indices.
    super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    trimesh_convex.m_UV.
    super__Vector_base<chrono::ChVector2<double>,_std::allocator<chrono::ChVector2<double>_>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    trimesh_convex.m_colors.super__Vector_base<chrono::ChColor,_std::allocator<chrono::ChColor>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    trimesh_convex.m_colors.super__Vector_base<chrono::ChColor,_std::allocator<chrono::ChColor>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    trimesh_convex.m_colors.super__Vector_base<chrono::ChColor,_std::allocator<chrono::ChColor>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    trimesh_convex.m_face_v_indices.
    super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    trimesh_convex.m_face_v_indices.
    super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    trimesh_convex.m_face_v_indices.
    super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    trimesh_convex.m_face_n_indices.
    super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    trimesh_convex.m_vertices.
    super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>._M_impl
    .super__Vector_impl_data._M_start = (pointer)0x0;
    trimesh_convex.m_vertices.
    super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>._M_impl
    .super__Vector_impl_data._M_finish = (pointer)0x0;
    trimesh_convex.m_vertices.
    super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>._M_impl
    .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    trimesh_convex.m_normals.
    super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>._M_impl
    .super__Vector_impl_data._M_start = (pointer)0x0;
    trimesh_convex.m_normals.
    super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>._M_impl
    .super__Vector_impl_data._M_finish = (pointer)0x0;
    trimesh_convex.m_normals.
    super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>._M_impl
    .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    trimesh_convex.m_UV.
    super__Vector_base<chrono::ChVector2<double>,_std::allocator<chrono::ChVector2<double>_>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    trimesh_convex.m_UV.
    super__Vector_base<chrono::ChVector2<double>,_std::allocator<chrono::ChVector2<double>_>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    trimesh_convex.m_filename._M_string_length = 0;
    trimesh_convex.m_filename.field_2._M_local_buf[0] = '\0';
    iVar7 = (*mydecompositionHACDv2.super_ChConvexDecomposition._vptr_ChConvexDecomposition[8])
                      (&mydecompositionHACDv2,uVar14,&trimesh_convex);
    if ((char)iVar7 != '\0') {
      geometry::ChTriangleMeshConnected::ComputeMassProperties
                (&trimesh_convex,true,&mass,&center,&inertia);
      local_468 = local_468 + mass;
    }
    geometry::ChTriangleMeshConnected::~ChTriangleMeshConnected(&trimesh_convex);
    uVar14 = (ulong)((uint)uVar14 + 1);
  } while ((char)iVar7 != '\0');
LAB_00e3435d:
  bVar15 = false;
LAB_00e3435f:
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&body.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  collision::ChConvexDecompositionHACDv2::~ChConvexDecompositionHACDv2(&mydecompositionHACDv2);
LAB_00e34376:
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&trimesh.
              super___shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  return bVar15;
LAB_00e33e82:
  if (uVar12 == uVar9) goto LAB_00e34344;
  std::make_shared<chrono::geometry::ChTriangleMeshConnected>();
  iVar7 = (*mydecompositionHACDv2.super_ChConvexDecomposition._vptr_ChConvexDecomposition[8])
                    (&mydecompositionHACDv2,(ulong)uVar12,
                     trimesh_convex_1.
                     super___shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr);
  if ((char)iVar7 == '\0') {
LAB_00e34353:
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&trimesh_convex_1.
                super___shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
    goto LAB_00e3435d;
  }
  geometry::ChTriangleMeshConnected::ComputeMassProperties
            (trimesh_convex_1.
             super___shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr,true,&mass,&center,&inertia);
  iVar7 = (*(system->super_ChIntegrableIIorder).super_ChIntegrable._vptr_ChIntegrable[0x30])();
  std::__shared_ptr<chrono::ChBody,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<chrono::ChBody,void>
            ((__shared_ptr<chrono::ChBody,(__gnu_cxx::_Lock_policy)2> *)&trimesh_convex,
             (ChBody *)CONCAT44(extraout_var,iVar7));
  std::__shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&body.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2> *)&trimesh_convex);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&trimesh_convex.m_vertices);
  ChVariablesBodyOwnMass::SetBodyMass
            (&(body.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              variables,mass);
  if (&((body.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
       super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>.coord !=
      (ChCoordsys<double> *)pos) {
    ((body.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->super_ChBodyFrame
    ).super_ChFrameMoving<double>.super_ChFrame<double>.coord.pos.m_data[0] = pos->m_data[0];
    ((body.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->super_ChBodyFrame
    ).super_ChFrameMoving<double>.super_ChFrame<double>.coord.pos.m_data[1] = pos->m_data[1];
    ((body.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->super_ChBodyFrame
    ).super_ChFrameMoving<double>.super_ChFrame<double>.coord.pos.m_data[2] = pos->m_data[2];
  }
  ChFrame<double>::SetRot
            ((ChFrame<double> *)
             &(body.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              super_ChBodyFrame,rot);
  ChBody::SetCollide(body.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr,true
                    );
  ChBody::SetBodyFixed
            (body.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr,false);
  convexhull.
  super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  convexhull.
  super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  convexhull.
  super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  iVar7 = (*mydecompositionHACDv2.super_ChConvexDecomposition._vptr_ChConvexDecomposition[9])
                    (&mydecompositionHACDv2,(ulong)uVar12,&convexhull);
  if ((char)iVar7 == '\0') {
    std::_Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>::
    ~_Vector_base(&convexhull.
                   super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                 );
    goto LAB_00e34353;
  }
  lVar13 = ((long)convexhull.
                  super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
           (long)convexhull.
                 super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                 ._M_impl.super__Vector_impl_data._M_start) / 0x18;
  pdVar11 = (convexhull.
             super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->m_data + 2;
  while (bVar15 = lVar13 != 0, lVar13 = lVar13 + -1, bVar15) {
    dVar1 = *pdVar11;
    auVar3._8_8_ = center.m_data[1];
    auVar3._0_8_ = center.m_data[0];
    auVar3 = vsubpd_avx(*(undefined1 (*) [16])((ChVector<double> *)(pdVar11 + -2))->m_data,auVar3);
    *(undefined1 (*) [16])((ChVector<double> *)(pdVar11 + -2))->m_data = auVar3;
    *pdVar11 = dVar1 - center.m_data[2];
    pdVar11 = pdVar11 + 3;
  }
  std::__shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2> *)
             &trimesh_convex,
             &((body.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              collision_model).
              super___shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>);
  (**(code **)(*(long *)trimesh_convex.super_ChTriangleMesh.super_ChGeometry._vptr_ChGeometry + 0x18
              ))();
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&trimesh_convex.m_vertices);
  std::__shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2> *)
             &local_b8,
             &((body.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              collision_model).
              super___shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>);
  pp_Var6 = local_b8._vptr_ChFrame;
  std::__shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_358,
             &material->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>);
  ChMatrix33<double>::Set_A_quaternion((ChMatrix33<double> *)&trimesh_convex,rot);
  (**(code **)(*pp_Var6 + 0x78))(pp_Var6,&local_358,&convexhull,pos,&trimesh_convex);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_358._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_b8.coord);
  std::__shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2> *)
             &trimesh_convex,
             &((body.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              collision_model).
              super___shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>);
  (**(code **)(*(long *)trimesh_convex.super_ChTriangleMesh.super_ChGeometry._vptr_ChGeometry + 0x20
              ))();
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&trimesh_convex.m_vertices);
  std::__cxx11::stringstream::stringstream((stringstream *)&trimesh_convex);
  poVar10 = std::operator<<((ostream *)
                            &trimesh_convex.m_vertices.
                             super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish,(string *)name);
  poVar10 = std::operator<<(poVar10,"_");
  std::ostream::operator<<(poVar10,uVar12);
  std::make_shared<chrono::ChVisualModel>();
  this = body.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__shared_ptr<chrono::ChVisualModel,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_378,&model.super___shared_ptr<chrono::ChVisualModel,_(__gnu_cxx::_Lock_policy)2>
            );
  ChPhysicsItem::AddVisualModel
            (&this->super_ChPhysicsItem,(shared_ptr<chrono::ChVisualModel> *)&local_378);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_378._M_refcount);
  chrono_types::make_shared<chrono::ChTriangleMeshShape,_0>();
  peVar5 = trimesh_shape.super___shared_ptr<chrono::ChTriangleMeshShape,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  std::__shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr(&local_388,
               &trimesh_convex_1.
                super___shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>
              );
  ChTriangleMeshShape::SetMesh
            (peVar5,(shared_ptr<chrono::geometry::ChTriangleMeshConnected> *)&local_388,true);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_388._M_refcount);
  peVar5 = trimesh_shape.super___shared_ptr<chrono::ChTriangleMeshShape,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::_M_assign((string *)&peVar5->name);
  std::__cxx11::string::~string((string *)&local_b8);
  ChPhysicsItem::GetVisualModel((ChPhysicsItem *)local_3d8);
  this_00 = local_3d8._0_8_;
  std::__shared_ptr<chrono::ChVisualShape,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<chrono::ChTriangleMeshShape,void>
            (local_398,
             &trimesh_shape.
              super___shared_ptr<chrono::ChTriangleMeshShape,_(__gnu_cxx::_Lock_policy)2>);
  local_348.m_data[2] = 0.0;
  local_2b0.m_data[0] = 1.0;
  local_2b0.m_data[3] = 0.0;
  local_348.m_data[0] = 0.0;
  local_348.m_data[1] = 0.0;
  local_2b0.m_data[1] = 0.0;
  local_2b0.m_data[2] = 0.0;
  ChFrame<double>::ChFrame(&local_b8,&local_348,&local_2b0);
  ChVisualModel::AddShape
            ((ChVisualModel *)this_00,(shared_ptr<chrono::ChVisualShape> *)local_398,&local_b8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_390);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_3d8 + 8));
  local_b8._vptr_ChFrame =
       (_func_int **)
       (local_468 *
        inertia.super_Matrix<double,_3,_3,_1,_3,_3>.
        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] *
       total_mass);
  local_b8.coord.pos.m_data[0] =
       local_468 *
       inertia.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] *
       total_mass;
  local_b8.coord.pos.m_data[1] =
       local_468 *
       inertia.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] *
       total_mass;
  ChBody::SetInertiaXX
            (body.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             (ChVector<double> *)&local_b8);
  std::__shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_3a8,&body.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>);
  (*(system->super_ChIntegrableIIorder).super_ChIntegrable._vptr_ChIntegrable[0x25])
            (system,&local_3a8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_3a8._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&trimesh_shape.
              super___shared_ptr<chrono::ChTriangleMeshShape,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&model.super___shared_ptr<chrono::ChVisualModel,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__cxx11::stringstream::~stringstream((stringstream *)&trimesh_convex);
  std::_Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>::
  ~_Vector_base(&convexhull.
                 super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
               );
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&trimesh_convex_1.
              super___shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  uVar12 = uVar12 + 1;
  goto LAB_00e33e82;
LAB_00e34344:
  bVar15 = true;
  goto LAB_00e3435f;
}

Assistant:

bool AddTriangleMeshConvexDecompositionSplit(ChSystem* system,
                                             std::shared_ptr<ChMaterialSurface> material,
                                             const std::string& obj_filename,
                                             const std::string& name,
                                             const ChVector<>& pos,
                                             const ChQuaternion<>& rot,
                                             double total_mass) {
    assert(material->GetContactMethod() == system->GetContactMethod());

    auto trimesh = geometry::ChTriangleMeshConnected::CreateFromWavefrontFile(obj_filename, true, false);
    if (!trimesh)
        return false;

    for (int i = 0; i < trimesh->m_vertices.size(); i++) {
        trimesh->m_vertices[i] = pos + rot.Rotate(trimesh->m_vertices[i]);
    }
    collision::ChConvexDecompositionHACDv2 mydecompositionHACDv2;

    int hacd_maxhullcount = 1024;
    int hacd_maxhullmerge = 256;
    int hacd_maxhullvertexes = 64;
    double hacd_concavity = 0.01;
    double hacd_smallclusterthreshold = 0.1;
    double hacd_fusetolerance = 1e-6;

    mydecompositionHACDv2.Reset();
    mydecompositionHACDv2.AddTriangleMesh(*trimesh);

    mydecompositionHACDv2.SetParameters(hacd_maxhullcount, hacd_maxhullmerge, hacd_maxhullvertexes,
                                        (float)hacd_concavity, (float)hacd_smallclusterthreshold,
                                        (float)hacd_fusetolerance);
    mydecompositionHACDv2.ComputeConvexDecomposition();
    collision::ChConvexDecomposition* used_decomposition = &mydecompositionHACDv2;

    int hull_count = used_decomposition->GetHullCount();

    std::shared_ptr<ChBody> body;
    double mass;
    ChVector<> center;
    ChMatrix33<> inertia;
    double sum = 0;
    for (int c = 0; c < hull_count; c++) {
        geometry::ChTriangleMeshConnected trimesh_convex;
        if (!used_decomposition->GetConvexHullResult(c, trimesh_convex))
            return false;
        trimesh_convex.ComputeMassProperties(true, mass, center, inertia);
        sum += mass;
    }

    double scale = 1.0 / sum;

    for (int c = 0; c < hull_count; c++) {
        auto trimesh_convex = chrono_types::make_shared<geometry::ChTriangleMeshConnected>();
        if (!used_decomposition->GetConvexHullResult(c, *trimesh_convex))
            return false;
        trimesh_convex->ComputeMassProperties(true, mass, center, inertia);

        body = std::shared_ptr<ChBody>(system->NewBody());
        body->SetMass(mass);
        body->SetPos(pos);
        body->SetRot(rot);
        body->SetCollide(true);
        body->SetBodyFixed(false);

        std::vector<ChVector<double>> convexhull;
        if (!used_decomposition->GetConvexHullResult(c, convexhull))
            return false;
        for (size_t v = 0; v < convexhull.size(); v++) {
            convexhull[v] = convexhull[v] - center;
        }

        body->GetCollisionModel()->ClearModel();
        body->GetCollisionModel()->AddConvexHull(material, convexhull, pos, rot);
        body->GetCollisionModel()->BuildModel();

        std::stringstream ss;
        ss << name << "_" << c;
        //      geometry::ChTriangleMeshConnected trimesh_convex;
        //      used_decomposition->GetConvexHullResult(c, trimesh_convex);

        auto model = chrono_types::make_shared<ChVisualModel>();
        body->AddVisualModel(model);

        auto trimesh_shape = chrono_types::make_shared<ChTriangleMeshShape>();
        trimesh_shape->SetMesh(trimesh_convex);
        trimesh_shape->SetName(ss.str());
        body->GetVisualModel()->AddShape(trimesh_shape, ChFrame<>());

        // std::cout << mass << " " << scale * mass* total_mass << " " <<
        // inertia(0, 0) << " " << inertia(1, 1) << " " << inertia(2, 2) << std::endl;
        body->SetInertiaXX(ChVector<>(inertia(0, 0) * scale * total_mass, inertia(1, 1) * scale * total_mass,
                                      inertia(2, 2) * scale * total_mass));

        system->AddBody(body);
    }

    return true;
}